

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O0

DEV_DEF ** SndEmu_GetDevDefList(UINT8 deviceID)

{
  DEV_DEF **ppDStack_10;
  UINT8 deviceID_local;
  
  switch(deviceID) {
  case '\0':
    ppDStack_10 = devDefList_SN76496;
    break;
  case '\x01':
    ppDStack_10 = devDefList_YM2413;
    break;
  case '\x02':
    ppDStack_10 = devDefList_YM2612;
    break;
  case '\x03':
    ppDStack_10 = devDefList_YM2151;
    break;
  case '\x04':
    ppDStack_10 = devDefList_SegaPCM;
    break;
  case '\x05':
    ppDStack_10 = devDefList_RF5C68;
    break;
  case '\x06':
    ppDStack_10 = devDefList_YM2203;
    break;
  case '\a':
    ppDStack_10 = devDefList_YM2608;
    break;
  case '\b':
    ppDStack_10 = devDefList_YM2610;
    break;
  case '\t':
    ppDStack_10 = devDefList_YM3812;
    break;
  case '\n':
    ppDStack_10 = devDefList_YM3526;
    break;
  case '\v':
    ppDStack_10 = devDefList_Y8950;
    break;
  case '\f':
    ppDStack_10 = devDefList_YMF262;
    break;
  case '\r':
    ppDStack_10 = devDefList_YMF278B;
    break;
  case '\x0e':
    ppDStack_10 = devDefList_YMF271;
    break;
  case '\x0f':
    ppDStack_10 = devDefList_YMZ280B;
    break;
  default:
    ppDStack_10 = (DEV_DEF **)0x0;
    break;
  case '\x11':
    ppDStack_10 = devDefList_32X_PWM;
    break;
  case '\x12':
    ppDStack_10 = devDefList_AY8910;
    break;
  case '\x13':
    ppDStack_10 = devDefList_GB_DMG;
    break;
  case '\x14':
    ppDStack_10 = devDefList_NES_APU;
    break;
  case '\x15':
    ppDStack_10 = devDefList_YMW258;
    break;
  case '\x16':
    ppDStack_10 = devDefList_uPD7759;
    break;
  case '\x17':
    ppDStack_10 = devDefList_OKIM6258;
    break;
  case '\x18':
    ppDStack_10 = devDefList_OKIM6295;
    break;
  case '\x19':
    ppDStack_10 = devDefList_K051649;
    break;
  case '\x1a':
    ppDStack_10 = devDefList_K054539;
    break;
  case '\x1b':
    ppDStack_10 = devDefList_C6280;
    break;
  case '\x1c':
    ppDStack_10 = devDefList_C140;
    break;
  case '\x1d':
    ppDStack_10 = devDefList_K053260;
    break;
  case '\x1e':
    ppDStack_10 = devDefList_Pokey;
    break;
  case '\x1f':
    ppDStack_10 = devDefList_QSound;
    break;
  case ' ':
    ppDStack_10 = devDefList_SCSP;
    break;
  case '!':
    ppDStack_10 = devDefList_WSwan;
    break;
  case '\"':
    ppDStack_10 = devDefList_VBoyVSU;
    break;
  case '#':
    ppDStack_10 = devDefList_SAA1099;
    break;
  case '$':
    ppDStack_10 = devDefList_ES5503;
    break;
  case '%':
    ppDStack_10 = devDefList_ES5506;
    break;
  case '&':
    ppDStack_10 = devDefList_X1_010;
    break;
  case '\'':
    ppDStack_10 = devDefList_C352;
    break;
  case '(':
    ppDStack_10 = devDefList_GA20;
    break;
  case ')':
    ppDStack_10 = devDefList_Mikey;
    break;
  case 0x80:
    ppDStack_10 = devDefList_C219;
  }
  return ppDStack_10;
}

Assistant:

const DEV_DEF** SndEmu_GetDevDefList(UINT8 deviceID)
{
	switch(deviceID)
	{
#ifdef SNDDEV_SN76496
	case DEVID_SN76496:
		return devDefList_SN76496;
#endif
#ifdef SNDDEV_YM2413
	case DEVID_YM2413:
		return devDefList_YM2413;
#endif
#ifdef SNDDEV_YM2612
	case DEVID_YM2612:
		return devDefList_YM2612;
#endif
#ifdef SNDDEV_YM2151
	case DEVID_YM2151:
		return devDefList_YM2151;
#endif
#ifdef SNDDEV_SEGAPCM
	case DEVID_SEGAPCM:
		return devDefList_SegaPCM;
#endif
#ifdef SNDDEV_RF5C68
	case DEVID_RF5C68:
		return devDefList_RF5C68;
#endif
#ifdef SNDDEV_YM2203
	case DEVID_YM2203:
		return devDefList_YM2203;
#endif
#ifdef SNDDEV_YM2608
	case DEVID_YM2608:
		return devDefList_YM2608;
#endif
#ifdef SNDDEV_YM2610
	case DEVID_YM2610:
		return devDefList_YM2610;
#endif
#ifdef SNDDEV_YM3812
	case DEVID_YM3812:
		return devDefList_YM3812;
#endif
#ifdef SNDDEV_YM3526
	case DEVID_YM3526:
		return devDefList_YM3526;
#endif
#ifdef SNDDEV_Y8950
	case DEVID_Y8950:
		return devDefList_Y8950;
#endif
#ifdef SNDDEV_YMF262
	case DEVID_YMF262:
		return devDefList_YMF262;
#endif
#ifdef SNDDEV_YMF278B
	case DEVID_YMF278B:
		return devDefList_YMF278B;
#endif
#ifdef SNDDEV_YMF271
	case DEVID_YMF271:
		return devDefList_YMF271;
#endif
#ifdef SNDDEV_YMZ280B
	case DEVID_YMZ280B:
		return devDefList_YMZ280B;
#endif
#ifdef SNDDEV_32X_PWM
	case DEVID_32X_PWM:
		return devDefList_32X_PWM;
#endif
#ifdef SNDDEV_AY8910
	case DEVID_AY8910:
		return devDefList_AY8910;
#endif
#ifdef SNDDEV_GAMEBOY
	case DEVID_GB_DMG:
		return devDefList_GB_DMG;
#endif
#ifdef SNDDEV_NES_APU
	case DEVID_NES_APU:
		return devDefList_NES_APU;
#endif
#ifdef SNDDEV_YMW258
	case DEVID_YMW258:
		return devDefList_YMW258;
#endif
#ifdef SNDDEV_UPD7759
	case DEVID_uPD7759:
		return devDefList_uPD7759;
#endif
#ifdef SNDDEV_OKIM6258
	case DEVID_OKIM6258:
		return devDefList_OKIM6258;
#endif
#ifdef SNDDEV_OKIM6295
	case DEVID_OKIM6295:
		return devDefList_OKIM6295;
#endif
#ifdef SNDDEV_K051649
	case DEVID_K051649:
		return devDefList_K051649;
#endif
#ifdef SNDDEV_K054539
	case DEVID_K054539:
		return devDefList_K054539;
#endif
#ifdef SNDDEV_C6280
	case DEVID_C6280:
		return devDefList_C6280;
#endif
#ifdef SNDDEV_C140
	case DEVID_C140:
		return devDefList_C140;
#endif
#ifdef SNDDEV_C219
	case DEVID_C219:
		return devDefList_C219;
#endif
#ifdef SNDDEV_K053260
	case DEVID_K053260:
		return devDefList_K053260;
#endif
#ifdef SNDDEV_POKEY
	case DEVID_POKEY:
		return devDefList_Pokey;
#endif
#ifdef SNDDEV_QSOUND
	case DEVID_QSOUND:
		return devDefList_QSound;
#endif
#ifdef SNDDEV_SCSP
	case DEVID_SCSP:
		return devDefList_SCSP;
#endif
#ifdef SNDDEV_WSWAN
	case DEVID_WSWAN:
		return devDefList_WSwan;
#endif
#ifdef SNDDEV_VBOY_VSU
	case DEVID_VBOY_VSU:
		return devDefList_VBoyVSU;
#endif
#ifdef SNDDEV_SAA1099
	case DEVID_SAA1099:
		return devDefList_SAA1099;
#endif
#ifdef SNDDEV_ES5503
	case DEVID_ES5503:
		return devDefList_ES5503;
#endif
#ifdef SNDDEV_ES5506
	case DEVID_ES5506:
		return devDefList_ES5506;
#endif
#ifdef SNDDEV_X1_010
	case DEVID_X1_010:
		return devDefList_X1_010;
#endif
#ifdef SNDDEV_C352
	case DEVID_C352:
		return devDefList_C352;
#endif
#ifdef SNDDEV_GA20
	case DEVID_GA20:
		return devDefList_GA20;
#endif
#ifdef SNDDEV_MIKEY
	case DEVID_MIKEY:
		return devDefList_Mikey;
#endif
	default:
		return NULL;
	}
}